

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNotBackUTF8(UnicodeSetStringSpan *this,uint8_t *s,int32_t length)

{
  int length_00;
  UBool UVar1;
  int32_t iVar2;
  int32_t length_01;
  int32_t iVar3;
  uint8_t *puStack_48;
  int32_t length8;
  uint8_t *s8;
  uint8_t *puStack_38;
  int32_t cpLength;
  uint8_t *spanBackUTF8Lengths;
  int32_t stringsLength;
  int32_t i;
  int32_t pos;
  int32_t length_local;
  uint8_t *s_local;
  UnicodeSetStringSpan *this_local;
  
  iVar2 = UVector::size(this->strings);
  puStack_38 = this->spanLengths;
  stringsLength = length;
  if (this->all != '\0') {
    puStack_38 = puStack_38 + iVar2 * 3;
  }
  while( true ) {
    length_01 = UnicodeSet::spanBackUTF8
                          (this->pSpanNotSet,(char *)s,stringsLength,USET_SPAN_NOT_CONTAINED);
    if (length_01 == 0) {
      return 0;
    }
    iVar3 = spanOneBackUTF8(&this->spanSet,s,length_01);
    if (0 < iVar3) break;
    puStack_48 = this->utf8;
    for (spanBackUTF8Lengths._4_4_ = 0; spanBackUTF8Lengths._4_4_ < iVar2;
        spanBackUTF8Lengths._4_4_ = spanBackUTF8Lengths._4_4_ + 1) {
      length_00 = this->utf8Lengths[spanBackUTF8Lengths._4_4_];
      if ((((length_00 != 0) && (puStack_38[spanBackUTF8Lengths._4_4_] != 0xff)) &&
          (length_00 <= length_01)) &&
         (UVar1 = matches8(s + ((long)length_01 - (long)length_00),puStack_48,length_00),
         UVar1 != '\0')) {
        return length_01;
      }
      puStack_48 = puStack_48 + length_00;
    }
    stringsLength = iVar3 + length_01;
    if (stringsLength == 0) {
      return 0;
    }
  }
  return length_01;
}

Assistant:

int32_t UnicodeSetStringSpan::spanNotBackUTF8(const uint8_t *s, int32_t length) const {
    int32_t pos=length;
    int32_t i, stringsLength=strings.size();
    uint8_t *spanBackUTF8Lengths=spanLengths;
    if(all) {
        spanBackUTF8Lengths+=3*stringsLength;
    }
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        pos=pSpanNotSet->spanBackUTF8((const char *)s, pos, USET_SPAN_NOT_CONTAINED);
        if(pos==0) {
            return 0;  // Reached the start of the string.
        }

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOneBackUTF8(spanSet, s, pos);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        const uint8_t *s8=utf8;
        int32_t length8;
        for(i=0; i<stringsLength; ++i) {
            length8=utf8Lengths[i];
            // ALL_CP_CONTAINED: Irrelevant string.
            if(length8!=0 && spanBackUTF8Lengths[i]!=ALL_CP_CONTAINED && length8<=pos && matches8(s+pos-length8, s8, length8)) {
                return pos;  // There is a set element at pos.
            }
            s8+=length8;
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos+=cpLength;
    } while(pos!=0);
    return 0;  // Reached the start of the string.
}